

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

string_view __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::SignColumn
          (anon_unknown_53 *this,bool neg,FormatConversionSpecImpl conv)

{
  FormatConversionChar FVar1;
  bool bVar2;
  undefined7 in_register_00000031;
  bool neg_local;
  undefined1 local_24 [8];
  FormatConversionSpecImpl conv_local;
  
  local_24._1_7_ = in_register_00000031;
  local_24[0] = neg;
  conv_local._0_4_ = conv._0_4_;
  FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)local_24);
  if ((FVar1 == 2) ||
     (FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)local_24),
     FVar1 == 3)) {
    if (((ulong)this & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&conv_local.width_,"-");
      return stack0xffffffffffffffe8;
    }
    bVar2 = FormatConversionSpecImpl::has_show_pos_flag((FormatConversionSpecImpl *)local_24);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&conv_local.width_,"+");
      return stack0xffffffffffffffe8;
    }
    bVar2 = FormatConversionSpecImpl::has_sign_col_flag((FormatConversionSpecImpl *)local_24);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&conv_local.width_," ");
      return stack0xffffffffffffffe8;
    }
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&conv_local.width_);
  return stack0xffffffffffffffe8;
}

Assistant:

string_view SignColumn(bool neg, const FormatConversionSpecImpl conv) {
  if (conv.conversion_char() == FormatConversionCharInternal::d ||
      conv.conversion_char() == FormatConversionCharInternal::i) {
    if (neg) return "-";
    if (conv.has_show_pos_flag()) return "+";
    if (conv.has_sign_col_flag()) return " ";
  }
  return {};
}